

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

ON_RTreeBBox * NodeCover(ON_RTreeBBox *__return_storage_ptr__,ON_RTreeNode *a_node)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ON_RTreeBranch *pOVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if (a_node->m_count < 1) {
    for (lVar10 = -3; lVar10 != 0; lVar10 = lVar10 + 1) {
      __return_storage_ptr__->m_max[lVar10] = 0.0;
      __return_storage_ptr__[1].m_min[lVar10] = 0.0;
    }
  }
  else {
    pOVar11 = a_node->m_branch;
    uVar9 = (ulong)(a_node->m_count - 1);
    dVar3 = a_node->m_branch[uVar9].m_rect.m_min[1];
    pdVar1 = a_node->m_branch[uVar9].m_rect.m_min + 2;
    dVar4 = *pdVar1;
    dVar5 = pdVar1[1];
    pdVar1 = a_node->m_branch[uVar9].m_rect.m_max + 1;
    dVar6 = *pdVar1;
    dVar7 = pdVar1[1];
    __return_storage_ptr__->m_min[0] = a_node->m_branch[uVar9].m_rect.m_min[0];
    __return_storage_ptr__->m_min[1] = dVar3;
    __return_storage_ptr__->m_min[2] = dVar4;
    __return_storage_ptr__->m_max[0] = dVar5;
    __return_storage_ptr__->m_max[1] = dVar6;
    __return_storage_ptr__->m_max[2] = dVar7;
    uVar22 = *(undefined4 *)__return_storage_ptr__->m_min;
    uVar23 = *(undefined4 *)((long)__return_storage_ptr__->m_min + 4);
    uVar24 = *(undefined4 *)(__return_storage_ptr__->m_min + 1);
    uVar25 = *(undefined4 *)((long)__return_storage_ptr__->m_min + 0xc);
    uVar18 = *(undefined4 *)(__return_storage_ptr__->m_min + 2);
    uVar19 = *(undefined4 *)((long)__return_storage_ptr__->m_min + 0x14);
    uVar20 = *(undefined4 *)__return_storage_ptr__->m_max;
    uVar21 = *(undefined4 *)((long)__return_storage_ptr__->m_max + 4);
    uVar14 = *(undefined4 *)(__return_storage_ptr__->m_max + 1);
    uVar15 = *(undefined4 *)((long)__return_storage_ptr__->m_max + 0xc);
    uVar16 = *(undefined4 *)(__return_storage_ptr__->m_max + 2);
    uVar17 = *(undefined4 *)((long)__return_storage_ptr__->m_max + 0x14);
    while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
      dVar3 = (pOVar11->m_rect).m_min[2];
      dVar4 = (pOVar11->m_rect).m_max[0];
      auVar26._4_4_ = uVar23;
      auVar26._0_4_ = uVar22;
      auVar26._8_4_ = uVar24;
      auVar26._12_4_ = uVar25;
      auVar26 = minpd(*(undefined1 (*) [16])(pOVar11->m_rect).m_min,auVar26);
      uVar12 = -(ulong)(dVar3 < (double)CONCAT44(uVar19,uVar18));
      uVar13 = -(ulong)((double)CONCAT44(uVar21,uVar20) < dVar4);
      auVar28._0_8_ = ~uVar12 & CONCAT44(uVar19,uVar18);
      auVar28._8_8_ = ~uVar13 & CONCAT44(uVar21,uVar20);
      auVar2._8_8_ = (ulong)dVar4 & uVar13;
      auVar2._0_8_ = (ulong)dVar3 & uVar12;
      auVar28 = auVar28 | auVar2;
      auVar27._4_4_ = uVar15;
      auVar27._0_4_ = uVar14;
      auVar27._8_4_ = uVar16;
      auVar27._12_4_ = uVar17;
      auVar27 = maxpd(*(undefined1 (*) [16])((pOVar11->m_rect).m_max + 1),auVar27);
      pOVar11 = pOVar11 + 1;
      uVar22 = auVar26._0_4_;
      uVar23 = auVar26._4_4_;
      uVar24 = auVar26._8_4_;
      uVar25 = auVar26._12_4_;
      uVar18 = auVar28._0_4_;
      uVar19 = auVar28._4_4_;
      uVar20 = auVar28._8_4_;
      uVar21 = auVar28._12_4_;
      uVar14 = auVar27._0_4_;
      uVar15 = auVar27._4_4_;
      uVar16 = auVar27._8_4_;
      uVar17 = auVar27._12_4_;
    }
    *(undefined4 *)(__return_storage_ptr__->m_min + 2) = uVar18;
    *(undefined4 *)((long)__return_storage_ptr__->m_min + 0x14) = uVar19;
    *(undefined4 *)__return_storage_ptr__->m_max = uVar20;
    *(undefined4 *)((long)__return_storage_ptr__->m_max + 4) = uVar21;
    *(undefined4 *)(__return_storage_ptr__->m_max + 1) = uVar14;
    *(undefined4 *)((long)__return_storage_ptr__->m_max + 0xc) = uVar15;
    *(undefined4 *)(__return_storage_ptr__->m_max + 2) = uVar16;
    *(undefined4 *)((long)__return_storage_ptr__->m_max + 0x14) = uVar17;
    *(undefined4 *)__return_storage_ptr__->m_min = uVar22;
    *(undefined4 *)((long)__return_storage_ptr__->m_min + 4) = uVar23;
    *(undefined4 *)(__return_storage_ptr__->m_min + 1) = uVar24;
    *(undefined4 *)((long)__return_storage_ptr__->m_min + 0xc) = uVar25;
  }
  return __return_storage_ptr__;
}

Assistant:

static ON_RTreeBBox NodeCover(ON_RTreeNode* a_node)
{
  int i;
  const ON_RTreeBranch* branch;
  ON_RTreeBBox rect;

  if ( (i = a_node->m_count) > 0 )
  {
    rect = a_node->m_branch[--i].m_rect;
    for ( branch = a_node->m_branch; i; i--, branch++ )
    {
#if (3 == ON_RTree_NODE_DIM)
      if ( rect.m_min[0] > branch->m_rect.m_min[0] )
        rect.m_min[0] = branch->m_rect.m_min[0];
      if ( rect.m_min[1] > branch->m_rect.m_min[1] )
        rect.m_min[1] = branch->m_rect.m_min[1];
      if ( rect.m_min[2] > branch->m_rect.m_min[2] )
        rect.m_min[2] = branch->m_rect.m_min[2];
      if ( rect.m_max[0] < branch->m_rect.m_max[0] )
        rect.m_max[0] = branch->m_rect.m_max[0];
      if ( rect.m_max[1] < branch->m_rect.m_max[1] )
        rect.m_max[1] = branch->m_rect.m_max[1];
      if ( rect.m_max[2] < branch->m_rect.m_max[2] )
        rect.m_max[2] = branch->m_rect.m_max[2];
#else
      for( int j = 0; j < ON_RTree_NODE_DIM; j++ )
      {
        if ( rect.m_min[j] > branch->m_rect.m_min[j] )
          rect.m_min[j] = branch->m_rect.m_min[j];
        if ( rect.m_max[j] < branch->m_rect.m_max[j] )
          rect.m_max[j] = branch->m_rect.m_max[j];
      }
#endif
    }
  }
  else
  {
    InitRect(&rect);
  }

  return rect;
}